

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float GetDraggedColumnOffset(int column_index)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiContext *pIVar4;
  ImGuiWindow *pIVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float x;
  ImGuiWindow *window;
  ImGuiContext *g;
  int column_index_local;
  
  pIVar4 = GImGui;
  pIVar5 = ImGui::GetCurrentWindowRead();
  if (column_index < 1) {
    __assert_fail("column_index > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x2451,"float GetDraggedColumnOffset(int)");
  }
  if (pIVar4->ActiveId == (pIVar5->DC).ColumnsSetId + column_index) {
    fVar8 = (pIVar4->IO).MousePos.x;
    fVar1 = (pIVar4->ActiveIdClickOffset).x;
    fVar2 = (pIVar5->Pos).x;
    fVar6 = ImGui::GetColumnOffset(column_index + -1);
    fVar3 = (pIVar4->Style).ColumnsMinSpacing;
    fVar7 = ImGui::GetColumnOffset(column_index + 1);
    fVar8 = ImClamp((fVar8 - fVar1) - fVar2,fVar6 + fVar3,fVar7 - (pIVar4->Style).ColumnsMinSpacing)
    ;
    return (float)(int)fVar8;
  }
  __assert_fail("g.ActiveId == window->DC.ColumnsSetId + ImGuiID(column_index)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                ,0x2452,"float GetDraggedColumnOffset(int)");
}

Assistant:

static float GetDraggedColumnOffset(int column_index)
{
    // Active (dragged) column always follow mouse. The reason we need this is that dragging a column to the right edge of an auto-resizing
    // window creates a feedback loop because we store normalized positions. So while dragging we enforce absolute positioning.
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = ImGui::GetCurrentWindowRead();
    IM_ASSERT(column_index > 0); // We cannot drag column 0. If you get this assert you may have a conflict between the ID of your columns and another widgets.
    IM_ASSERT(g.ActiveId == window->DC.ColumnsSetId + ImGuiID(column_index));

    float x = g.IO.MousePos.x - g.ActiveIdClickOffset.x - window->Pos.x;
    x = ImClamp(x, ImGui::GetColumnOffset(column_index-1)+g.Style.ColumnsMinSpacing, ImGui::GetColumnOffset(column_index+1)-g.Style.ColumnsMinSpacing);

    return (float)(int)x;
}